

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eci.cc
# Opt level: O0

void __thiscall libsgp4::Eci::ToEci(Eci *this,DateTime *dt,CoordGeodetic *geo)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double achcp;
  double s;
  double c;
  double theta;
  CoordGeodetic *geo_local;
  DateTime *dt_local;
  Eci *this_local;
  
  (this->m_dt).m_encoded = dt->m_encoded;
  dVar1 = DateTime::ToLocalMeanSiderealTime(&this->m_dt,geo->longitude);
  dVar2 = sin(geo->latitude);
  dVar2 = pow(dVar2,2.0);
  dVar3 = sqrt(dVar2 * -0.006694317778266723 + 1.0);
  dVar4 = pow(0.9966472205458325,2.0);
  dVar2 = geo->altitude;
  dVar5 = cos(geo->latitude);
  dVar5 = ((1.0 / dVar3) * 6378.135 + dVar2) * dVar5;
  dVar2 = cos(dVar1);
  (this->m_position).x = dVar5 * dVar2;
  dVar2 = sin(dVar1);
  (this->m_position).y = dVar5 * dVar2;
  dVar2 = geo->altitude;
  dVar1 = sin(geo->latitude);
  (this->m_position).z = (dVar4 * (1.0 / dVar3) * 6378.135 + dVar2) * dVar1;
  dVar2 = Vector::Magnitude(&this->m_position);
  (this->m_position).w = dVar2;
  (this->m_velocity).x = (this->m_position).y * -7.292115855228083e-05;
  (this->m_velocity).y = (this->m_position).x * 7.292115855228083e-05;
  (this->m_velocity).z = 0.0;
  dVar2 = Vector::Magnitude(&this->m_velocity);
  (this->m_velocity).w = dVar2;
  return;
}

Assistant:

void Eci::ToEci(const DateTime& dt, const CoordGeodetic &geo)
{
    /*
     * set date
     */
    m_dt = dt;

    static const double mfactor = kTWOPI * (kOMEGA_E / kSECONDS_PER_DAY);

    /*
     * Calculate Local Mean Sidereal Time for observers longitude
     */
    const double theta = m_dt.ToLocalMeanSiderealTime(geo.longitude);

    /*
     * take into account earth flattening
     */
    const double c = 1.0
        / sqrt(1.0 + kF * (kF - 2.0) * pow(sin(geo.latitude), 2.0));
    const double s = pow(1.0 - kF, 2.0) * c;
    const double achcp = (kXKMPER * c + geo.altitude) * cos(geo.latitude);

    /*
     * X position in km
     * Y position in km
     * Z position in km
     * W magnitude in km
     */
    m_position.x = achcp * cos(theta);
    m_position.y = achcp * sin(theta);
    m_position.z = (kXKMPER * s + geo.altitude) * sin(geo.latitude);
    m_position.w = m_position.Magnitude();

    /*
     * X velocity in km/s
     * Y velocity in km/s
     * Z velocity in km/s
     * W magnitude in km/s
     */
    m_velocity.x = -mfactor * m_position.y;
    m_velocity.y = mfactor * m_position.x;
    m_velocity.z = 0.0;
    m_velocity.w = m_velocity.Magnitude();
}